

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvatiming.c
# Opt level: O1

void time_pcounter_nv10(uint cnum)

{
  void *pvVar1;
  nva_card **ppnVar2;
  
  puts("Perf counter:");
  ppnVar2 = nva_cards;
  pvVar1 = nva_cards[(int)cnum]->bar0;
  *(undefined4 *)((long)pvVar1 + 0xa73c) = 0;
  *(undefined4 *)((long)pvVar1 + 0xa404) = 0;
  *(undefined4 *)((long)pvVar1 + 0xa40c) = 0xffff;
  *(undefined4 *)((long)pvVar1 + 0xa414) = 0xffff;
  *(undefined4 *)((long)pvVar1 + 0xa41c) = 0;
  *(undefined4 *)((long)pvVar1 + 0xa620) = 0;
  *(undefined4 *)((long)pvVar1 + 0xa624) = 0;
  *(undefined4 *)((long)pvVar1 + 0xa628) = 0;
  *(undefined4 *)((long)pvVar1 + 0xa62c) = 0;
  if (0x1f < (ppnVar2[cnum]->chipset).card_type) {
    *(undefined4 *)((long)pvVar1 + 0xa504) = 0;
    *(undefined4 *)((long)pvVar1 + 0xa50c) = 0xffff;
    *(undefined4 *)((long)pvVar1 + 0xa514) = 0xffff;
    *(undefined4 *)((long)pvVar1 + 0xa51c) = 0;
    *(undefined4 *)((long)pvVar1 + 0xa720) = 0;
    *(undefined4 *)((long)pvVar1 + 0xa724) = 0;
    *(undefined4 *)((long)pvVar1 + 0xa728) = 0;
    *(undefined4 *)((long)pvVar1 + 0xa72c) = 0;
    *(undefined4 *)((long)pvVar1 + 0xa504) = 0xffff;
  }
  *(undefined4 *)((long)pvVar1 + 0xa404) = 0xffff;
  sleep(1);
  printf("Set 0: %d Hz\n",(ulong)*(uint *)((long)nva_cards[(int)cnum]->bar0 + 0xa608));
  if (0x1f < (nva_cards[cnum]->chipset).card_type) {
    printf("Set 1: %u Hz\n",(ulong)*(uint *)((long)nva_cards[(int)cnum]->bar0 + 0xa708));
    return;
  }
  return;
}

Assistant:

void time_pcounter_nv10(unsigned int cnum)
{
	printf ("Perf counter:\n");


	nva_wr32(cnum, 0xa73c, 0);
	nva_wr32(cnum, 0xa404, 0);
	nva_wr32(cnum, 0xa40c, 0xffff);
	nva_wr32(cnum, 0xa414, 0xffff);
	nva_wr32(cnum, 0xa41c, 0);
	nva_wr32(cnum, 0xa620, 0);
	nva_wr32(cnum, 0xa624, 0);
	nva_wr32(cnum, 0xa628, 0);
	nva_wr32(cnum, 0xa62c, 0);
	if (nva_cards[cnum]->chipset.card_type >= 0x20) {
		nva_wr32(cnum, 0xa504, 0);
		nva_wr32(cnum, 0xa50c, 0xffff);
		nva_wr32(cnum, 0xa514, 0xffff);
		nva_wr32(cnum, 0xa51c, 0);
		nva_wr32(cnum, 0xa720, 0);
		nva_wr32(cnum, 0xa724, 0);
		nva_wr32(cnum, 0xa728, 0);
		nva_wr32(cnum, 0xa72c, 0);
		nva_wr32(cnum, 0xa504, 0xffff);
	}
	nva_wr32(cnum, 0xa404, 0xffff);
	sleep(1);
	printf ("Set 0: %d Hz\n", nva_rd32(cnum, 0xa608));
	if (nva_cards[cnum]->chipset.card_type >= 0x20) {
		printf ("Set 1: %u Hz\n", nva_rd32(cnum, 0xa708));
	}
}